

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O2

void __thiscall
moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits>
::ExplicitProducer::ExplicitProducer
          (ExplicitProducer *this,
          ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits>
          *parent)

{
  unsigned_long uVar1;
  
  (this->super_ProducerBase).super_ConcurrentQueueProducerTypelessBase.next =
       (ConcurrentQueueProducerTypelessBase *)0x0;
  (this->super_ProducerBase).super_ConcurrentQueueProducerTypelessBase.inactive._M_base._M_i = false
  ;
  (this->super_ProducerBase).super_ConcurrentQueueProducerTypelessBase.token = (ProducerToken *)0x0;
  (this->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i = 0;
  (this->super_ProducerBase).headIndex.super___atomic_base<unsigned_long>._M_i = 0;
  (this->super_ProducerBase).dequeueOptimisticCount.super___atomic_base<unsigned_long>._M_i = 0;
  (this->super_ProducerBase).dequeueOvercommit.super___atomic_base<unsigned_long>._M_i = 0;
  (this->super_ProducerBase).tailBlock = (Block *)0x0;
  (this->super_ProducerBase).isExplicit = true;
  (this->super_ProducerBase).parent = parent;
  (this->super_ProducerBase)._vptr_ProducerBase = (_func_int **)&PTR__ExplicitProducer_00181900;
  (this->blockIndex)._M_b._M_p = (__pointer_type)0x0;
  this->pr_blockIndexSlotsUsed = 0;
  this->pr_blockIndexSize = 0x10;
  this->pr_blockIndexFront = 0;
  this->pr_blockIndexEntries = (BlockIndexEntry *)0x0;
  this->pr_blockIndexRaw = (void *)0x0;
  uVar1 = details::ceil_to_pow_2<unsigned_long>(parent->initialBlockPoolSize);
  if (0x21 < uVar1) {
    this->pr_blockIndexSize = uVar1 >> 1;
  }
  new_block_index(this,0);
  return;
}

Assistant:

explicit ExplicitProducer(ConcurrentQueue* parent) :
			ProducerBase(parent, true),
			blockIndex(nullptr),
			pr_blockIndexSlotsUsed(0),
			pr_blockIndexSize(EXPLICIT_INITIAL_INDEX_SIZE >> 1),
			pr_blockIndexFront(0),
			pr_blockIndexEntries(nullptr),
			pr_blockIndexRaw(nullptr)
		{
			size_t poolBasedIndexSize = details::ceil_to_pow_2(parent->initialBlockPoolSize) >> 1;
			if (poolBasedIndexSize > pr_blockIndexSize) {
				pr_blockIndexSize = poolBasedIndexSize;
			}
			
			new_block_index(0);		// This creates an index with double the number of current entries, i.e. EXPLICIT_INITIAL_INDEX_SIZE
		}